

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::anon_unknown_0::FileContainsExtensions
               (FileDescriptor *file)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  Descriptor *message;
  ulong uVar5;
  
  bVar3 = true;
  if (*(int *)(file + 0x3c) < 1) {
    uVar5 = (ulong)*(int *)(file + 0x2c);
    bVar3 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      message = *(Descriptor **)(file + 0x58);
      bVar2 = MessageContainsExtensions(message);
      if (!bVar2) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          message = message + 0x88;
          if (uVar5 == uVar4) break;
          bVar3 = MessageContainsExtensions(message);
          uVar1 = uVar4 + 1;
        } while (!bVar3);
        bVar3 = uVar4 < uVar5;
      }
    }
  }
  return bVar3;
}

Assistant:

bool FileContainsExtensions(const FileDescriptor* file) {
  if (file->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageContainsExtensions(file->message_type(i))) {
      return true;
    }
  }
  return false;
}